

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt_num.c
# Opt level: O3

char * lj_strfmt_wuint9(char *p,uint32_t u)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar4 = (u / 100000000) * -10000 + u / 10000;
  uVar3 = (uint)(iVar4 * 0x20c5) >> 0x17;
  iVar4 = uVar3 * -1000 + iVar4;
  uVar5 = (uint)(iVar4 * 0x29) >> 0xc;
  iVar4 = uVar5 * -100 + iVar4;
  cVar1 = (char)((uint)(iVar4 * 0x67) >> 10);
  uVar8 = (u % 10000) % 1000;
  uVar7 = uVar8 * 0x29 >> 0xc;
  iVar6 = uVar7 * -100 + uVar8;
  cVar2 = (char)((uint)(iVar6 * 0x67) >> 10);
  *(ulong *)p = CONCAT17(cVar2 + '0',
                         CONCAT16((char)uVar7 + '0',
                                  CONCAT15((char)((u % 10000) / 1000) + '0',
                                           CONCAT14(cVar1 * -10 + (char)iVar4 + '0',
                                                    CONCAT13(cVar1 + '0',
                                                             CONCAT12((char)uVar5 + '0',
                                                                      CONCAT11((char)uVar3 + '0',
                                                                               (char)(u / 100000000)
                                                                               + '0')))))));
  p[8] = cVar2 * -10 + (char)iVar6 + '0';
  return p + 9;
}

Assistant:

static char *lj_strfmt_wuint9(char *p, uint32_t u)
{
  uint32_t v = u / 10000, w;
  u -= v * 10000;
  w = v / 10000;
  v -= w * 10000;
  *p++ = (char)('0'+w);
  WINT_R(v, 23, 1000)
  WINT_R(v, 12, 100)
  WINT_R(v, 10, 10)
  *p++ = (char)('0'+v);
  WINT_R(u, 23, 1000)
  WINT_R(u, 12, 100)
  WINT_R(u, 10, 10)
  *p++ = (char)('0'+u);
  return p;
}